

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameColumnFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  undefined8 uVar1;
  char *zOld_00;
  Select *p;
  long lVar2;
  int iVar3;
  int bQuote_00;
  int iVar4;
  int iVar5;
  uchar *zSql_00;
  uchar *zDatabase;
  uchar *zName;
  uchar *zNew_00;
  Parse *pPVar6;
  Parse *pPVar7;
  uchar *local_2b8;
  int local_2b0;
  int local_2ac;
  ExprList *pUpsertSet;
  Table *pTarget;
  TriggerStep *pStep;
  FKey *pFKey;
  int bFKOnly;
  Select *pSelect;
  sqlite3_xauth xAuth;
  Table *pTab;
  Table *pTStack_260;
  int i;
  Index *pIdx;
  Walker sWalker;
  Parse sParse;
  int rc;
  char *zOld;
  int bTemp;
  int bQuote;
  char *zNew;
  int iCol;
  char *zTable;
  char *zDb;
  char *zSql;
  RenameCtx sCtx;
  sqlite3 *db;
  sqlite3_value **argv_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  sCtx.zOld = (char *)sqlite3_context_db_handle(context);
  zSql_00 = sqlite3_value_text(*argv);
  zDatabase = sqlite3_value_text(argv[3]);
  zName = sqlite3_value_text(argv[4]);
  iVar3 = sqlite3_value_int(argv[5]);
  zNew_00 = sqlite3_value_text(argv[6]);
  bQuote_00 = sqlite3_value_int(argv[7]);
  iVar4 = sqlite3_value_int(argv[8]);
  uVar1 = *(undefined8 *)(sCtx.zOld + 0x1a0);
  if (zSql_00 == (uchar *)0x0) {
    return;
  }
  if (zName == (uchar *)0x0) {
    return;
  }
  if (zNew_00 == (uchar *)0x0) {
    return;
  }
  if (iVar3 < 0) {
    return;
  }
  sqlite3BtreeEnterAll((sqlite3 *)sCtx.zOld);
  pPVar6 = (Parse *)sqlite3FindTable((sqlite3 *)sCtx.zOld,(char *)zName,(char *)zDatabase);
  if ((pPVar6 == (Parse *)0x0) || (*(i16 *)((long)&pPVar6->nLabel + 2) <= iVar3)) {
    sqlite3BtreeLeaveAll((sqlite3 *)sCtx.zOld);
    return;
  }
  zOld_00 = ((Column *)pPVar6->zErrMsg)[iVar3].zName;
  memset(&zSql,0,0x20);
  local_2ac = iVar3;
  if (iVar3 == (short)pPVar6->nLabel) {
    local_2ac = -1;
  }
  sCtx.pList._4_4_ = local_2ac;
  sCtx.zOld[0x1a0] = '\0';
  sCtx.zOld[0x1a1] = '\0';
  sCtx.zOld[0x1a2] = '\0';
  sCtx.zOld[0x1a3] = '\0';
  sCtx.zOld[0x1a4] = '\0';
  sCtx.zOld[0x1a5] = '\0';
  sCtx.zOld[0x1a6] = '\0';
  sCtx.zOld[0x1a7] = '\0';
  sParse.pRename._4_4_ =
       renameParseSql((Parse *)&sWalker.u,(char *)zDatabase,0,(sqlite3 *)sCtx.zOld,(char *)zSql_00,
                      iVar4);
  memset(&pIdx,0,0x30);
  pIdx = (Index *)&sWalker.u;
  sWalker.pParse = (Parse *)renameColumnExprCb;
  sWalker.xExprCallback = renameColumnSelectCb;
  sWalker._32_8_ = &zSql;
  sCtx._8_8_ = pPVar6;
  if (sParse.pRename._4_4_ == 0) {
    if (sParse.zTail == (char *)0x0) {
      if (sParse.pNewTable == (Table *)0x0) {
        local_2b8 = zDatabase;
        if (iVar4 != 0) {
          local_2b8 = (uchar *)0x0;
        }
        sParse.pRename._4_4_ = renameResolveTrigger((Parse *)&sWalker.u,(char *)local_2b8);
        if (sParse.pRename._4_4_ != 0) goto LAB_002658da;
        for (pTarget = (Table *)(sParse.pNewIndex)->aSortOrder; pTarget != (Table *)0x0;
            pTarget = *(Table **)&pTarget->nRowLogEst) {
          if ((pTarget->pSelect != (Select *)0x0) &&
             (pPVar7 = (Parse *)sqlite3LocateTable((Parse *)&sWalker.u,0,(char *)pTarget->pSelect,
                                                   (char *)zDatabase), pPVar7 == pPVar6)) {
            lVar2._0_4_ = pTarget->tnum;
            lVar2._4_4_ = pTarget->nTabRef;
            if (lVar2 != 0) {
              renameColumnElistNames
                        ((Parse *)&sWalker.u,(RenameCtx *)&zSql,
                         *(ExprList **)(*(long *)&pTarget->tnum + 0x10),zOld_00);
            }
            renameColumnIdlistNames
                      ((Parse *)&sWalker.u,(RenameCtx *)&zSql,(IdList *)pTarget->pCheck,zOld_00);
            renameColumnElistNames
                      ((Parse *)&sWalker.u,(RenameCtx *)&zSql,(ExprList *)pTarget->zColAff,zOld_00);
          }
        }
        if (sParse.pToplevel == pPVar6) {
          renameColumnIdlistNames
                    ((Parse *)&sWalker.u,(RenameCtx *)&zSql,(IdList *)(sParse.pNewIndex)->zColAff,
                     zOld_00);
        }
        renameWalkTrigger((Walker *)&pIdx,(Trigger *)sParse.pNewIndex);
      }
      else {
        sqlite3WalkExprList((Walker *)&pIdx,*(ExprList **)&(sParse.pNewTable)->addColOffset);
        sqlite3WalkExpr((Walker *)&pIdx,*(Expr **)&(sParse.pNewTable)->nRowLogEst);
      }
    }
    else {
      p = *(Select **)(sParse.zTail + 0x18);
      if (p == (Select *)0x0) {
        iVar4 = sqlite3_stricmp((char *)zName,*(char **)sParse.zTail);
        sCtx._8_8_ = sParse.zTail;
        if (iVar4 == 0) {
          renameTokenFind((Parse *)&sWalker.u,(RenameCtx *)&zSql,
                          *(void **)(*(long *)(sParse.zTail + 8) + (long)iVar3 * 0x20));
          if (sCtx.pList._4_4_ < 0) {
            renameTokenFind((Parse *)&sWalker.u,(RenameCtx *)&zSql,sParse.zTail + 0x44);
          }
          sqlite3WalkExprList((Walker *)&pIdx,*(ExprList **)(sParse.zTail + 0x30));
          for (pTStack_260 = *(Table **)(sParse.zTail + 0x10); pTStack_260 != (Table *)0x0;
              pTStack_260 = *(Table **)((long)pTStack_260 + 0x28)) {
            sqlite3WalkExprList((Walker *)&pIdx,*(ExprList **)((long)pTStack_260 + 0x50));
          }
          for (pTStack_260 = sParse.pNewTable; pTStack_260 != (Table *)0x0;
              pTStack_260 = (Table *)pTStack_260->zColAff) {
            sqlite3WalkExprList((Walker *)&pIdx,*(ExprList **)&pTStack_260->addColOffset);
          }
        }
        for (pStep = *(TriggerStep **)(sParse.zTail + 0x20); pStep != (TriggerStep *)0x0;
            pStep = (TriggerStep *)pStep->pTrig) {
          for (pTab._4_4_ = 0; pTab._4_4_ < *(int *)&pStep->pExprList; pTab._4_4_ = pTab._4_4_ + 1)
          {
            if ((iVar4 == 0) && (*(int *)(&pStep->zSpan + (long)pTab._4_4_ * 2) == iVar3)) {
              renameTokenFind((Parse *)&sWalker.u,(RenameCtx *)&zSql,
                              &pStep->zSpan + (long)pTab._4_4_ * 2);
            }
            iVar5 = sqlite3_stricmp((char *)pStep->pSelect,(char *)zName);
            if ((iVar5 == 0) &&
               (iVar5 = sqlite3_stricmp((char *)(&pStep->pNext)[(long)pTab._4_4_ * 2],zOld_00),
               iVar5 == 0)) {
              renameTokenFind((Parse *)&sWalker.u,(RenameCtx *)&zSql,
                              (&pStep->pNext)[(long)pTab._4_4_ * 2]);
            }
          }
        }
      }
      else {
        sqlite3SelectPrep((Parse *)&sWalker.u,*(Select **)(sParse.zTail + 0x18),(NameContext *)0x0);
        if (sCtx.zOld[0x61] == '\0') {
          local_2b0 = 0;
        }
        else {
          local_2b0 = 7;
        }
        sParse.pRename._4_4_ = local_2b0;
        if (local_2b0 != 0) goto LAB_002658da;
        sqlite3WalkSelect((Walker *)&pIdx,p);
      }
    }
    sParse.pRename._4_4_ =
         renameEditSql(context,(RenameCtx *)&zSql,(char *)zSql_00,(char *)zNew_00,bQuote_00);
  }
LAB_002658da:
  if (sParse.pRename._4_4_ != 0) {
    if (sParse.db == (sqlite3 *)0x0) {
      sqlite3_result_error_code(context,sParse.pRename._4_4_);
    }
    else {
      renameColumnParseError(context,0,argv[1],argv[2],(Parse *)&sWalker.u);
    }
  }
  renameParseCleanup((Parse *)&sWalker.u);
  renameTokenFree((sqlite3 *)sCtx.zOld,(RenameToken *)zSql);
  *(undefined8 *)(sCtx.zOld + 0x1a0) = uVar1;
  sqlite3BtreeLeaveAll((sqlite3 *)sCtx.zOld);
  return;
}

Assistant:

static void renameColumnFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  RenameCtx sCtx;
  const char *zSql = (const char*)sqlite3_value_text(argv[0]);
  const char *zDb = (const char*)sqlite3_value_text(argv[3]);
  const char *zTable = (const char*)sqlite3_value_text(argv[4]);
  int iCol = sqlite3_value_int(argv[5]);
  const char *zNew = (const char*)sqlite3_value_text(argv[6]);
  int bQuote = sqlite3_value_int(argv[7]);
  int bTemp = sqlite3_value_int(argv[8]);
  const char *zOld;
  int rc;
  Parse sParse;
  Walker sWalker;
  Index *pIdx;
  int i;
  Table *pTab;
#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
#endif

  UNUSED_PARAMETER(NotUsed);
  if( zSql==0 ) return;
  if( zTable==0 ) return;
  if( zNew==0 ) return;
  if( iCol<0 ) return;
  sqlite3BtreeEnterAll(db);
  pTab = sqlite3FindTable(db, zTable, zDb);
  if( pTab==0 || iCol>=pTab->nCol ){
    sqlite3BtreeLeaveAll(db);
    return;
  }
  zOld = pTab->aCol[iCol].zName;
  memset(&sCtx, 0, sizeof(sCtx));
  sCtx.iCol = ((iCol==pTab->iPKey) ? -1 : iCol);

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = 0;
#endif
  rc = renameParseSql(&sParse, zDb, 0, db, zSql, bTemp);

  /* Find tokens that need to be replaced. */
  memset(&sWalker, 0, sizeof(Walker));
  sWalker.pParse = &sParse;
  sWalker.xExprCallback = renameColumnExprCb;
  sWalker.xSelectCallback = renameColumnSelectCb;
  sWalker.u.pRename = &sCtx;

  sCtx.pTab = pTab;
  if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
  if( sParse.pNewTable ){
    Select *pSelect = sParse.pNewTable->pSelect;
    if( pSelect ){
      sParse.rc = SQLITE_OK;
      sqlite3SelectPrep(&sParse, sParse.pNewTable->pSelect, 0);
      rc = (db->mallocFailed ? SQLITE_NOMEM : sParse.rc);
      if( rc==SQLITE_OK ){
        sqlite3WalkSelect(&sWalker, pSelect);
      }
      if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
    }else{
      /* A regular table */
      int bFKOnly = sqlite3_stricmp(zTable, sParse.pNewTable->zName);
      FKey *pFKey;
      assert( sParse.pNewTable->pSelect==0 );
      sCtx.pTab = sParse.pNewTable;
      if( bFKOnly==0 ){
        renameTokenFind(
            &sParse, &sCtx, (void*)sParse.pNewTable->aCol[iCol].zName
        );
        if( sCtx.iCol<0 ){
          renameTokenFind(&sParse, &sCtx, (void*)&sParse.pNewTable->iPKey);
        }
        sqlite3WalkExprList(&sWalker, sParse.pNewTable->pCheck);
        for(pIdx=sParse.pNewTable->pIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
        for(pIdx=sParse.pNewIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
      }

      for(pFKey=sParse.pNewTable->pFKey; pFKey; pFKey=pFKey->pNextFrom){
        for(i=0; i<pFKey->nCol; i++){
          if( bFKOnly==0 && pFKey->aCol[i].iFrom==iCol ){
            renameTokenFind(&sParse, &sCtx, (void*)&pFKey->aCol[i]);
          }
          if( 0==sqlite3_stricmp(pFKey->zTo, zTable)
           && 0==sqlite3_stricmp(pFKey->aCol[i].zCol, zOld)
          ){
            renameTokenFind(&sParse, &sCtx, (void*)pFKey->aCol[i].zCol);
          }
        }
      }
    }
  }else if( sParse.pNewIndex ){
    sqlite3WalkExprList(&sWalker, sParse.pNewIndex->aColExpr);
    sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
  }else{
    /* A trigger */
    TriggerStep *pStep;
    rc = renameResolveTrigger(&sParse, (bTemp ? 0 : zDb));
    if( rc!=SQLITE_OK ) goto renameColumnFunc_done;

    for(pStep=sParse.pNewTrigger->step_list; pStep; pStep=pStep->pNext){
      if( pStep->zTarget ){ 
        Table *pTarget = sqlite3LocateTable(&sParse, 0, pStep->zTarget, zDb);
        if( pTarget==pTab ){
          if( pStep->pUpsert ){
            ExprList *pUpsertSet = pStep->pUpsert->pUpsertSet;
            renameColumnElistNames(&sParse, &sCtx, pUpsertSet, zOld);
          }
          renameColumnIdlistNames(&sParse, &sCtx, pStep->pIdList, zOld);
          renameColumnElistNames(&sParse, &sCtx, pStep->pExprList, zOld);
        }
      }
    }


    /* Find tokens to edit in UPDATE OF clause */
    if( sParse.pTriggerTab==pTab ){
      renameColumnIdlistNames(&sParse, &sCtx,sParse.pNewTrigger->pColumns,zOld);
    }

    /* Find tokens to edit in various expressions and selects */
    renameWalkTrigger(&sWalker, sParse.pNewTrigger);
  }

  assert( rc==SQLITE_OK );
  rc = renameEditSql(context, &sCtx, zSql, zNew, bQuote);

renameColumnFunc_done:
  if( rc!=SQLITE_OK ){
    if( sParse.zErrMsg ){
      renameColumnParseError(context, 0, argv[1], argv[2], &sParse);
    }else{
      sqlite3_result_error_code(context, rc);
    }
  }

  renameParseCleanup(&sParse);
  renameTokenFree(db, sCtx.pList);
#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
  sqlite3BtreeLeaveAll(db);
}